

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  ulong uVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  char cVar9;
  ImGuiWindow *window;
  ImGuiID IVar10;
  bool bVar11;
  ImGuiContext *g;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect group_bb;
  ImRect local_38;
  ImVec2 local_28;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar3 = (GImGui->GroupStack).Size;
  pIVar5 = (GImGui->GroupStack).Data;
  if ((pIVar4->DC).IsSetPos == true) {
    (pIVar4->DC).IsSetPos = false;
    IVar2 = (pIVar4->DC).CursorPos;
    fVar14 = IVar2.x;
    fVar15 = IVar2.y;
    IVar2 = (pIVar4->DC).CursorMaxPos;
    fVar16 = IVar2.x;
    fVar17 = IVar2.y;
    uVar12 = -(uint)(fVar14 <= fVar16);
    uVar13 = -(uint)(fVar15 <= fVar17);
    (pIVar4->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar13 & (uint)fVar15,~uVar12 & (uint)fVar14) |
                 CONCAT44((uint)fVar17 & uVar13,(uint)fVar16 & uVar12));
  }
  IVar2 = (pIVar4->DC).CursorMaxPos;
  fVar14 = IVar2.x;
  fVar15 = IVar2.y;
  local_38.Min.x = pIVar5[(long)iVar3 + -1].BackupCursorPos.x;
  local_38.Min.y = pIVar5[(long)iVar3 + -1].BackupCursorPos.y;
  uVar6 = CONCAT44(~-(uint)(local_38.Min.y <= fVar15) & (uint)local_38.Min.y,
                   ~-(uint)(local_38.Min.x <= fVar14) & (uint)local_38.Min.x) |
          CONCAT44((uint)fVar15 & -(uint)(local_38.Min.y <= fVar15),
                   (uint)fVar14 & -(uint)(local_38.Min.x <= fVar14));
  local_38.Max.x = (float)uVar6;
  local_38.Max.y = (float)(uVar6 >> 0x20);
  (pIVar4->DC).CursorPos.x = local_38.Min.x;
  (pIVar4->DC).CursorPos.y = local_38.Min.y;
  fVar16 = pIVar5[(long)iVar3 + -1].BackupCursorMaxPos.x;
  fVar17 = pIVar5[(long)iVar3 + -1].BackupCursorMaxPos.y;
  uVar12 = -(uint)(fVar14 <= fVar16);
  uVar13 = -(uint)(fVar15 <= fVar17);
  (pIVar4->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar13 & (uint)fVar15,~uVar12 & (uint)fVar14) |
               CONCAT44((uint)fVar17 & uVar13,(uint)fVar16 & uVar12));
  (pIVar4->DC).Indent.x = pIVar5[(long)iVar3 + -1].BackupIndent.x;
  (pIVar4->DC).GroupOffset.x = pIVar5[(long)iVar3 + -1].BackupGroupOffset.x;
  (pIVar4->DC).CurrLineSize = pIVar5[(long)iVar3 + -1].BackupCurrLineSize;
  (pIVar4->DC).CurrLineTextBaseOffset = pIVar5[(long)iVar3 + -1].BackupCurrLineTextBaseOffset;
  if (pIVar8->LogEnabled == true) {
    pIVar8->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar5[(long)iVar3 + -1].EmitItem != true) goto LAB_001f85d6;
  fVar14 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar12 = -(uint)(pIVar5[(long)iVar3 + -1].BackupCurrLineTextBaseOffset <= fVar14);
  (pIVar4->DC).CurrLineTextBaseOffset =
       (float)(~uVar12 & (uint)pIVar5[(long)iVar3 + -1].BackupCurrLineTextBaseOffset |
              (uint)fVar14 & uVar12);
  local_28.y = local_38.Max.y - local_38.Min.y;
  local_28.x = local_38.Max.x - local_38.Min.x;
  ItemSize(&local_28,-1.0);
  bVar11 = false;
  ItemAdd(&local_38,0,(ImRect *)0x0,1);
  IVar10 = pIVar8->ActiveId;
  if (pIVar5[(long)iVar3 + -1].BackupActiveIdIsAlive != IVar10) {
    bVar11 = IVar10 != 0 && pIVar8->ActiveIdIsAlive == IVar10;
  }
  if (pIVar5[(long)iVar3 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar9 = pIVar8->ActiveIdPreviousFrameIsAlive;
  }
  else {
    cVar9 = '\0';
  }
  if (bVar11) {
LAB_001f8562:
    (pIVar8->LastItemData).ID = IVar10;
  }
  else if (cVar9 != '\0') {
    IVar10 = pIVar8->ActiveIdPreviousFrame;
    goto LAB_001f8562;
  }
  IVar2.y = local_38.Min.y;
  IVar2.x = local_38.Min.x;
  IVar7.y = local_38.Max.y;
  IVar7.x = local_38.Max.x;
  (pIVar8->LastItemData).Rect.Min = IVar2;
  (pIVar8->LastItemData).Rect.Max = IVar7;
  if ((pIVar5[(long)iVar3 + -1].BackupHoveredIdIsAlive == false) && (pIVar8->HoveredId != 0)) {
    pIVar1 = &(pIVar8->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar11) && (pIVar8->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar8->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar12 = (pIVar8->LastItemData).StatusFlags;
  (pIVar8->LastItemData).StatusFlags = uVar12 | 0x20;
  if ((cVar9 != '\0') && (pIVar8->ActiveId != pIVar8->ActiveIdPreviousFrame)) {
    (pIVar8->LastItemData).StatusFlags = uVar12 | 0x60;
  }
LAB_001f85d6:
  (pIVar8->GroupStack).Size = (pIVar8->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}